

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall parser::~parser(parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppVar1;
  
  if (this->input != (io_buf *)0x0) {
    (*this->input->_vptr_io_buf[3])();
  }
  if (this->output != (io_buf *)0x0) {
    (*this->output->_vptr_io_buf[3])();
  }
  this_00 = (this->jsonp).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::condition_variable::~condition_variable(&this->output_done);
  std::condition_variable::~condition_variable(&(this->ready_parsed_examples).is_not_empty);
  std::condition_variable::~condition_variable(&(this->ready_parsed_examples).is_not_full);
  std::_Deque_base<example_*,_std::allocator<example_*>_>::~_Deque_base
            ((_Deque_base<example_*,_std::allocator<example_*>_> *)
             &(this->ready_parsed_examples).object_queue);
  std::
  vector<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
  ::~vector(&(this->example_pool).m_chunks);
  ppVar1 = (this->example_pool).m_chunk_bounds.
           super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1);
  }
  std::_Deque_base<example_*,_std::allocator<example_*>_>::~_Deque_base
            ((_Deque_base<example_*,_std::allocator<example_*>_> *)&(this->example_pool).m_pool);
  return;
}

Assistant:

~parser()
  {
    delete input;
    delete output;
  }